

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task.hpp
# Opt level: O2

Task * __thiscall tf::Task::succeed<tf::Task&,tf::Task&>(Task *this,Task *tasks,Task *tasks_1)

{
  Node::_precede(tasks->_node,this->_node);
  Node::_precede(tasks_1->_node,this->_node);
  return this;
}

Assistant:

Task& Task::succeed(Ts&&... tasks) {
  (tasks._node->_precede(_node), ...);
  //_succeed(std::forward<Ts>(tasks)...);
  return *this;
}